

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathParseName(xmlXPathParserContextPtr ctxt)

{
  ulong uVar1;
  xmlChar *pxVar2;
  bool bVar3;
  size_t count;
  xmlChar *ret;
  xmlChar *in;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->cur == (xmlChar *)0x0)) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else {
    ret = ctxt->cur;
    if ((((0x60 < *ret) && (*ret < 0x7b)) || ((0x40 < *ret && (*ret < 0x5b)))) ||
       ((*ret == 0x5f || (*ret == 0x3a)))) {
      do {
        ret = ret + 1;
        if (((*ret < 0x61) || (bVar3 = true, 0x7a < *ret)) &&
           ((((*ret < 0x41 || (bVar3 = true, 0x5a < *ret)) &&
             ((*ret < 0x30 || (bVar3 = true, 0x39 < *ret)))) &&
            (((bVar3 = true, *ret != '_' && (bVar3 = true, *ret != '-')) &&
             (bVar3 = true, *ret != ':')))))) {
          bVar3 = *ret == '.';
        }
      } while (bVar3);
      if ((*ret != '\0') && (*ret < 0x80)) {
        uVar1 = (long)ret - (long)ctxt->cur;
        if (50000 < uVar1) {
          ctxt->cur = ret;
          xmlXPathErr(ctxt,7);
          return (xmlChar *)0x0;
        }
        pxVar2 = xmlStrndup(ctxt->cur,(int)uVar1);
        if (pxVar2 == (xmlChar *)0x0) {
          xmlXPathPErrMemory(ctxt);
        }
        ctxt->cur = ret;
        return pxVar2;
      }
    }
    ctxt_local = (xmlXPathParserContextPtr)xmlXPathParseNameComplex(ctxt,1);
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

xmlChar *
xmlXPathParseName(xmlXPathParserContextPtr ctxt) {
    const xmlChar *in;
    xmlChar *ret;
    size_t count = 0;

    if ((ctxt == NULL) || (ctxt->cur == NULL)) return(NULL);
    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->cur;
    if (((*in >= 0x61) && (*in <= 0x7A)) ||
	((*in >= 0x41) && (*in <= 0x5A)) ||
	(*in == '_') || (*in == ':')) {
	in++;
	while (((*in >= 0x61) && (*in <= 0x7A)) ||
	       ((*in >= 0x41) && (*in <= 0x5A)) ||
	       ((*in >= 0x30) && (*in <= 0x39)) ||
	       (*in == '_') || (*in == '-') ||
	       (*in == ':') || (*in == '.'))
	    in++;
	if ((*in > 0) && (*in < 0x80)) {
	    count = in - ctxt->cur;
            if (count > XML_MAX_NAME_LENGTH) {
                ctxt->cur = in;
                XP_ERRORNULL(XPATH_EXPR_ERROR);
            }
	    ret = xmlStrndup(ctxt->cur, count);
            if (ret == NULL)
                xmlXPathPErrMemory(ctxt);
	    ctxt->cur = in;
	    return(ret);
	}
    }
    return(xmlXPathParseNameComplex(ctxt, 1));
}